

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

Header * readJPG(string *filename)

{
  pointer *ppuVar1;
  iterator iVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  Header *header;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  Header *header_00;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  byte last;
  ifstream inFile;
  byte local_242;
  byte local_241;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    header = (Header *)operator_new(0x1e70,(nothrow_t *)&std::nothrow);
    if (header != (Header *)0x0) {
      header->startOfSelection = '\0';
      header->endOfSelection = '?';
      header->successiveApproximationHigh = '\0';
      header->successiveApproximationLow = '\0';
      local_240 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&header->huffmanData;
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (header->huffmanData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar13 = 0xd4;
      do {
        memset((void *)((long)header + lVar13 + -0xb4),0,0xb3);
        memset(header->huffmanDCTables[0].offsets + lVar13 + -0x20,0,0x289);
        lVar13 = lVar13 + 0x340;
      } while (lVar13 != 0xdd4);
      lVar13 = 0xd20;
      do {
        memset(header->huffmanDCTables[0].offsets + lVar13 + -0x20,0,0xb3);
        memset((void *)((long)header->huffmanDCTables[0].codes + lVar13 + -0x20),0,0x289);
        lVar13 = lVar13 + 0x340;
      } while (lVar13 != 0x1a20);
      header->zeroBased = false;
      memset(header->quantizationTables,0,0x101);
      memset(header->quantizationTables + 1,0,0x101);
      memset(header->quantizationTables + 2,0,0x101);
      header_00 = (Header *)0x0;
      memset(header->quantizationTables + 3,0,0x101);
      lVar13 = 0x1e36;
      do {
        pbVar11 = header->huffmanDCTables[0].offsets + lVar13 + -0x22;
        pbVar11[0] = '\x01';
        pbVar11[1] = '\x01';
        pbVar11 = header->huffmanDCTables[0].offsets + lVar13 + -0x20;
        pbVar11[0] = '\0';
        pbVar11[1] = '\0';
        pbVar11[2] = '\0';
        pbVar11[3] = '\0';
        lVar13 = lVar13 + 6;
      } while (lVar13 != 0x1e48);
      header->frameType = '\0';
      header->restartInterval = 0;
      header->numComponents = '\0';
      header->height = 0;
      header->width = 0;
      header->valid = true;
      header->mcuHeight = 0;
      header->mcuWidth = 0;
      header->mcuHeightReal = 0;
      header->mcuWidthReal = 0;
      header->horizontalSamplingFactor = '\x01';
      header->verticalSamplingFactor = '\x01';
      local_242 = std::istream::get();
      cVar3 = std::istream::get();
      if ((cVar3 != -0x28) || (local_242 != 0xff)) {
        header->valid = false;
        std::ifstream::close();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"not JPEG file",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
        goto LAB_00103ac3;
      }
      local_242 = std::istream::get();
      uVar5 = std::istream::get();
      bVar4 = header->valid;
      if ((bool)bVar4 == true) {
        pcVar10 = "Error File ended premature";
        do {
          if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
            lVar13 = 0x1a;
            goto LAB_00103fc6;
          }
          if (local_242 != 0xff) {
            lVar13 = 0x17;
            pcVar10 = "Error expected a marker";
            goto LAB_00103fc6;
          }
          uVar12 = uVar5 & 0xff;
          if (uVar12 == 0xc0) {
            header->frameType = 0xc0;
            header_00 = header;
            readStartOfFrame((ifstream *)local_238,header);
LAB_00103d68:
            local_242 = std::istream::get();
          }
          else {
            if ((uVar5 & 0xf0) == 0xe0) {
              readAPPN((ifstream *)local_238,header_00);
              goto LAB_00103d68;
            }
            uVar8 = uVar5 & 0xff;
            if (0xdc < uVar8) {
              if (uVar8 == 0xdd) {
                header_00 = header;
                readRestartInterval((ifstream *)local_238,header);
              }
              else {
                if (uVar8 != 0xfe) goto LAB_00103d9b;
LAB_00103d46:
                readComment((ifstream *)local_238,header_00);
              }
              goto LAB_00103d68;
            }
            if (uVar8 == 0xc4) {
              header_00 = header;
              readHuffmanTable((ifstream *)local_238,header);
              goto LAB_00103d68;
            }
            if (uVar8 == 0xdb) {
              header_00 = header;
              readQuantizationTable((ifstream *)local_238,header);
              goto LAB_00103d68;
            }
            if (uVar8 == 0xda) {
              readStartOfScan((ifstream *)local_238,header);
              bVar4 = header->valid;
              goto LAB_00103ed4;
            }
LAB_00103d9b:
            if (((uVar12 == 0xdf) ||
                (header_00 = (Header *)(ulong)(uVar5 & 0xfd), (uVar5 & 0xfd) == 0xdc)) ||
               (header_00 = (Header *)(ulong)(uVar12 - 0xf0), uVar12 - 0xf0 < 0xe))
            goto LAB_00103d46;
            if (uVar8 < 0xd8) {
              if (uVar8 == 1) goto LAB_00103d68;
              if (uVar8 != 0xcc) {
LAB_001041b5:
                if ((uVar5 & 0xf0) == 0xc0) {
                  lVar13 = 0x24;
                  pcVar10 = "Error - SOF marker not supported: 0x";
                }
                else {
                  if ((uVar5 & 0xf8) == 0xd0) {
                    lVar13 = 0x22;
                    pcVar10 = "Error - RSTN detected before SOS \n";
                    goto LAB_001041a9;
                  }
                  lVar13 = 0x19;
                  pcVar10 = "Error - Unknow marker 0x:";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar10,lVar13);
                goto LAB_00104139;
              }
              lVar13 = 0x2d;
              pcVar10 = "Error - Arithmetic Coding code not supported\n";
LAB_001041a9:
              poVar7 = (ostream *)&std::cout;
              goto LAB_001040e6;
            }
            if (uVar8 != 0xff) {
              if (uVar8 == 0xd8) {
                lVar13 = 0x23;
                pcVar10 = "Error -Embedded JPGs not supported\n";
              }
              else {
                if (uVar8 != 0xd9) goto LAB_001041b5;
                lVar13 = 0x20;
                pcVar10 = "Error - EOI detected before SOS\n";
              }
              goto LAB_001041a9;
            }
          }
          uVar5 = std::istream::get();
        } while (header->valid != false);
        bVar4 = 0;
      }
LAB_00103ed4:
      if ((bVar4 & 1) == 0) {
LAB_0010401c:
        uVar6 = (ulong)header->numComponents;
        if ((header->numComponents | 2) != 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error - ",8);
          local_241 = header->numComponents;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_241,1);
          lVar13 = 0x22;
          pcVar10 = "required color compoenent 1 or 3 \n";
LAB_001040e6:
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar13);
          goto LAB_00104006;
        }
        pbVar11 = &header->colorComponent[0].quantizationTableID;
        pcVar10 = "Error - using uninitialized quantization talbe\n";
        do {
          uVar9 = (ulong)*pbVar11;
          if ((&header->quantizationTables[0].set)[(ulong)*pbVar11 * 0x100 + uVar9 * 4] == false) {
            lVar13 = 0x2f;
LAB_001040ff:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar13)
            ;
            header->valid = false;
            std::ifstream::close();
            goto LAB_00103ac3;
          }
          lVar13 = 0x2d;
          if (header->huffmanACTables[uVar9].set == false) {
            pcVar10 = "Error - using uninitialized Huffman AC talbe\n";
            goto LAB_001040ff;
          }
          if (header->huffmanDCTables[uVar9].set == false) {
            pcVar10 = "Error - using uninitialized Huffman DC talbe\n";
            goto LAB_001040ff;
          }
          pbVar11 = pbVar11 + 6;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      else {
        bVar4 = std::istream::get();
        lVar13 = 0x1a;
        pcVar10 = "Error File ended premature";
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
          do {
            local_242 = bVar4;
            bVar4 = std::istream::get();
            if (local_242 == 0xff) {
              if (bVar4 == 0) {
                iVar2._M_current =
                     (header->huffmanData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (header->huffmanData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>(local_240,iVar2,&local_242);
                }
                else {
                  *iVar2._M_current = 0xff;
                  ppuVar1 = &(header->huffmanData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar1 = *ppuVar1 + 1;
                }
LAB_00103fa0:
                bVar4 = std::istream::get();
                goto LAB_00103fab;
              }
              if (bVar4 != 0xd9) {
                if ((bVar4 & 0xf8) == 0xd0) goto LAB_00103fa0;
                if (bVar4 == 0xff) goto LAB_00103fab;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "Error Invalid marker during compressed data scan: 0x",0x34);
LAB_00104139:
                *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::ofstream::~ofstream + *(long *)(std::cout + -0x18)) & 0xffffffb5
                     | 8;
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
                     *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_00104006;
              }
              goto LAB_0010401c;
            }
            iVar2._M_current =
                 (header->huffmanData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (header->huffmanData).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>(local_240,iVar2,&local_242);
            }
            else {
              *iVar2._M_current = local_242;
              ppuVar1 = &(header->huffmanData).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
LAB_00103fab:
          } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0);
          pcVar10 = "Error File ended premature";
        }
LAB_00103fc6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
        std::ostream::put(-0x48);
        std::ostream::flush();
LAB_00104006:
        header->valid = false;
      }
      std::ifstream::close();
      goto LAB_00103ac3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Memory error",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    std::ifstream::close();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error opening file",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  header = (Header *)0x0;
LAB_00103ac3:
  std::ifstream::~ifstream(local_238);
  return header;
}

Assistant:

Header* readJPG(const std::string filename) {
	std::ifstream inFile = std::ifstream(filename, std::ios::in | std::ios::binary);
	if (!inFile) {
		std::cout << "Error opening file" <<std::endl;
		return nullptr;
	}

	Header* header = new(std::nothrow) Header;
	if (header == nullptr) {
		std::cout << "Memory error" << std::endl;
		inFile.close();
		return nullptr;
	}

	byte last = inFile.get();
	byte current = inFile.get();

	if (last != 0xff || current != SOI) {
		header->valid = false;
		inFile.close();
		std::cout << "not JPEG file" << std::endl;
		return header;
	}

	last = inFile.get();
	current = inFile.get();
	while (header->valid) {
		if (!inFile) {
			std::cout << "Error File ended premature" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		if (last != 0xff) {
			std::cout << "Error expected a marker" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		// 读取frame类型 只支持baseline
		if (current == SOF0) {
			header->frameType = SOF0;
			readStartOfFrame(inFile, header);
		}  
		/*
			APPn的处理
			An APPn marker may appear anywhere within a JPEG file.
			By convention, applications that create APPn markers store their name at the start of the marker to prevent conflicts with other applications.
		*/
		else if (current >= APP0 && current <= APP15) {
			readAPPN(inFile, header);
		}
		/*
			DQT的处理
			An DQT marker may appear anywhere within a JPEG file.
			one restriction is if a scan requires a quantization table
			it must have been defined in a previous DQT marker
		*/
		else if (current == DQT) {
			readQuantizationTable(inFile, header);
		} 
		/*
			DRI的处理
			Define Restart Interval marker specifies the number of MCUs 
			between restart markers within the compressed data.
			A DRI marker may appear anywhere in the file to define or redefine the restart interval.
			A DRI marker must appear somwhere in the file for a compressed data segment to include restart markers
			
		*/
		else if (current == DRI) {
			readRestartInterval(inFile, header);
		}
		/*
			DHT处理，哈夫曼表
		*/
		else if (current == DHT) {
			readHuffmanTable(inFile, header);
			
		}
		/*
			Start of Scan

		*/
		else if (current == SOS) {
			readStartOfScan(inFile, header);
			break;
		} //skip
		else if (current == COM){
			readComment(inFile, header);
		} //unnecessary, skip
		else if ((current >= JPG0 && current <= JPG13) || current == DNL || current == DHP || current == EXP) {
			readComment(inFile, header);
		}
		else if (current == TEM) {
			//TEM has no size
		}
		/*
			FF may be used as a fill character before the start of any marker
			just ignore
		*/
		else if (current == 0xFF) {
			current = inFile.get();
			continue;
		} 
		else if (current == SOI) {
			std::cout << "Error -Embedded JPGs not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		} 
		else if (current == EOI) {
			std::cout << "Error - EOI detected before SOS\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current == DAC) {
			std::cout << "Error - Arithmetic Coding code not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= SOF0 && current <= SOF15) {
			std::cout << "Error - SOF marker not supported: 0x" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= RST0 && current <= RST7) {
			std::cout << "Error - RSTN detected before SOS \n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else {
			std::cout << "Error - Unknow marker 0x:" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		last = inFile.get();
		current = inFile.get();
	}

	/*
		after SOS
		压缩数据的处理
		FF00代表00
		FFFF 多个FF的话，只当做一个FF
		会遇到RST, DNL, EOI
	*/
	if (header->valid) {
		current = inFile.get();
		//read compressed image data
		while (true) {
			if (!inFile) {
				std::cout << "Error File ended premature" << std::endl;
				header->valid = false;
				inFile.close();
				return header;
			}
			last = current;
			current = inFile.get();
			//marker or FF
			if (last == 0xFF) {
				//end of image
				if (current == EOI) {
					break;
				} 
				// 0xFF00 means FF
				else if (current == 0x00) {
					header->huffmanData.push_back(last);
					current = inFile.get();
				}
				//restart marker
				else if (current >= RST0 && current <= RST7) {
					current = inFile.get();
				}
				//ignore multiple 0xFF
				else if (current == 0xFF) {
					// do nothing, one FF will be ignored.
					continue;
				}
				else {
					std::cout << "Error Invalid marker during compressed data scan: 0x" << std::hex << (uint)current << std::dec << std::endl;
					header->valid = false;
					inFile.close();
					return header;
				}
			}
			else {
				header->huffmanData.push_back(last);
			}
		}
	}

	//invalid header info
	if (header->numComponents != 1 && header->numComponents != 3) {
		std::cout << "Error - " << header->numComponents << "required color compoenent 1 or 3 \n";
		header->valid = false;
		inFile.close();
		return header;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		if (header->quantizationTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized quantization talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanACTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman AC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanDCTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman DC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
	}
	inFile.close();
	return header;
}